

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coleitr.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationElementIterator::operator==
          (CollationElementIterator *this,CollationElementIterator *that)

{
  int8_t iVar1;
  int8_t iVar2;
  UBool UVar3;
  int iVar4;
  bool local_29;
  CollationElementIterator *that_local;
  CollationElementIterator *this_local;
  
  if (this == that) {
    return '\x01';
  }
  if ((this->rbc_ != that->rbc_) &&
     (iVar4 = (*(this->rbc_->super_Collator).super_UObject._vptr_UObject[3])(this->rbc_,that->rbc_),
     (char)iVar4 == '\0')) {
    return '\0';
  }
  local_29 = false;
  if (this->otherHalf_ == that->otherHalf_) {
    iVar1 = normalizeDir(this);
    iVar2 = normalizeDir(that);
    local_29 = false;
    if (iVar1 == iVar2) {
      UVar3 = icu_63::UnicodeString::operator==(&this->string_,&that->string_);
      local_29 = false;
      if (UVar3 != '\0') {
        iVar4 = (*(this->iter_->super_UObject)._vptr_UObject[3])(this->iter_,that->iter_);
        local_29 = (char)iVar4 != '\0';
      }
    }
  }
  return local_29;
}

Assistant:

UBool CollationElementIterator::operator==(
                                    const CollationElementIterator& that) const
{
    if (this == &that) {
        return TRUE;
    }

    return
        (rbc_ == that.rbc_ || *rbc_ == *that.rbc_) &&
        otherHalf_ == that.otherHalf_ &&
        normalizeDir() == that.normalizeDir() &&
        string_ == that.string_ &&
        *iter_ == *that.iter_;
}